

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float __thiscall ImGuiMenuColumns::DeclColumns(ImGuiMenuColumns *this,float w0,float w1,float w2)

{
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int i;
  float local_28;
  int local_18;
  
  in_RDI[2] = 0.0;
  fVar1 = ImMax<float>(in_RDI[6],in_XMM0_Da);
  in_RDI[6] = fVar1;
  fVar1 = ImMax<float>(in_RDI[7],in_XMM1_Da);
  in_RDI[7] = fVar1;
  fVar1 = ImMax<float>(in_RDI[8],in_XMM2_Da);
  in_RDI[8] = fVar1;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    if ((local_18 < 1) || (in_RDI[(long)local_18 + 6] <= 0.0)) {
      local_28 = 0.0;
    }
    else {
      local_28 = *in_RDI;
    }
    in_RDI[2] = in_RDI[(long)local_18 + 6] + local_28 + in_RDI[2];
  }
  fVar1 = ImMax<float>(in_RDI[1],in_RDI[2]);
  return fVar1;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < IM_ARRAYSIZE(Pos); i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}